

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Caliper.cpp
# Opt level: O2

Channel __thiscall cali::Caliper::get_channel(Caliper *this,cali_id_t id)

{
  __shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  long lVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2> *p_Var3;
  long lVar4;
  Channel CVar5;
  
  p_Var3 = *(__shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2> **)
            (*(long *)(id + 8) + 0x8100);
  p_Var1 = *(__shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2> **)
            (*(long *)(id + 8) + 0x8108);
  lVar2 = (long)p_Var1 - (long)p_Var3;
  for (lVar4 = lVar2 >> 6; 0 < lVar4; lVar4 = lVar4 + -1) {
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var3->_M_ptr->id == in_RDX._M_pi)
    goto LAB_001fd58a;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(p_Var3[1]._M_ptr)->id == in_RDX._M_pi) {
      p_Var3 = p_Var3 + 1;
      goto LAB_001fd58a;
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(p_Var3[2]._M_ptr)->id == in_RDX._M_pi) {
      p_Var3 = p_Var3 + 2;
      goto LAB_001fd58a;
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(p_Var3[3]._M_ptr)->id == in_RDX._M_pi) {
      p_Var3 = p_Var3 + 3;
      goto LAB_001fd58a;
    }
    p_Var3 = p_Var3 + 4;
    lVar2 = lVar2 + -0x40;
  }
  lVar2 = lVar2 >> 4;
  if (lVar2 == 1) {
LAB_001fd56e:
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var3->_M_ptr->id != in_RDX._M_pi) {
      p_Var3 = p_Var1;
    }
LAB_001fd58a:
    if (p_Var3 != p_Var1) {
      std::__shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2> *)this,p_Var3);
      in_RDX._M_pi = extraout_RDX;
      goto LAB_001fd59f;
    }
  }
  else {
    if (lVar2 == 2) {
LAB_001fd562:
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var3->_M_ptr->id != in_RDX._M_pi) {
        p_Var3 = p_Var3 + 1;
        goto LAB_001fd56e;
      }
      goto LAB_001fd58a;
    }
    if (lVar2 == 3) {
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var3->_M_ptr->id != in_RDX._M_pi) {
        p_Var3 = p_Var3 + 1;
        goto LAB_001fd562;
      }
      goto LAB_001fd58a;
    }
  }
  (this->super_CaliperMetadataAccessInterface)._vptr_CaliperMetadataAccessInterface =
       (_func_int **)0x0;
  this->sG = (GlobalData *)0x0;
LAB_001fd59f:
  CVar5.mP.super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  CVar5.mP.super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Channel)CVar5.mP.super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Channel Caliper::get_channel(cali_id_t id)
{
    auto it = std::find_if(sG->all_channels.begin(), sG->all_channels.end(), [id](const Channel& channel) {
        return id == channel.id();
    });

    return it == sG->all_channels.end() ? Channel() : *it;
}